

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O1

int Connectublox(UBLOX *publox,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  char line [256];
  char local_298;
  char local_297;
  timespec local_198;
  int *local_188;
  BOOL *local_180;
  BOOL *local_178;
  int *local_170;
  int *local_168;
  double *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  BOOL *local_130;
  BOOL *local_128;
  char *local_120;
  char *local_118;
  BOOL *local_110;
  BOOL *local_108;
  BOOL *local_100;
  BOOL *local_f8;
  BOOL *local_f0;
  BOOL *local_e8;
  BOOL *local_e0;
  BOOL *local_d8;
  BOOL *local_d0;
  BOOL *local_c8;
  BOOL *local_c0;
  BOOL *local_b8;
  BOOL *local_b0;
  BOOL *local_a8;
  BOOL *local_a0;
  BOOL *local_98;
  BOOL *local_90;
  BOOL *local_88;
  BOOL *local_80;
  BOOL *local_78;
  BOOL *local_70;
  BOOL *local_68;
  BOOL *local_60;
  BOOL *local_58;
  BOOL *local_50;
  BOOL *local_48;
  BOOL *local_40;
  BOOL *local_38;
  
  memset(publox->szCfgFilePath,0,0x100);
  sprintf(publox->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_298,0,0x100);
    memset(publox->szDevPath + 5,0,0xfb);
    builtin_strncpy(publox->szDevPath,"COM1",5);
    publox->BaudRate = 0x2580;
    publox->timeout = 1000;
    publox->threadperiod = 100;
    publox->bSaveRawData = 1;
    publox->bRevertToDefaultCfg = 1;
    publox->SetCfg = 0;
    publox->SurveyMode = 0;
    publox->svinMinDur = 30.0;
    publox->svinAccLimit = 10.0;
    publox->fixedLat = 0.0;
    publox->fixedLon = 0.0;
    publox->fixedAlt = 0.0;
    publox->fixedPosAcc = 10.0;
    local_40 = &publox->bSaveCfg;
    memset(local_40,0,0x10c);
    builtin_strncpy(publox->szStartSentence,"$GPS_START",0xb);
    local_38 = &publox->bSendStopSentence;
    memset(local_38,0,0x104);
    builtin_strncpy(publox->szStopSentence,"$GPS_STOP",10);
    publox->bEnable_NMEA_GGA = 0;
    publox->bEnable_NMEA_RMC = 0;
    publox->bEnable_NMEA_GLL = 0;
    publox->bEnable_NMEA_VTG = 0;
    publox->bEnable_NMEA_HDG = 0;
    publox->bEnable_NMEA_HDT = 0;
    publox->bEnable_NMEA_ROT = 0;
    publox->bEnable_NMEA_MWV = 0;
    publox->bEnable_NMEA_MWD = 0;
    publox->bEnable_NMEA_MDA = 0;
    publox->bEnable_NMEA_DID = 0;
    publox->bEnable_NMEA_VDM = 0;
    publox->bEnable_NMEA_PD6_SA = 0;
    publox->bEnable_NMEA_PD6_TS = 0;
    publox->bEnable_NMEA_PD6_BI = 0;
    publox->bEnable_NMEA_PD6_BS = 0;
    publox->bEnable_NMEA_PD6_BS = 0;
    publox->bEnable_NMEA_PD6_BE = 0;
    publox->bEnable_NMEA_PD6_BD = 0;
    publox->bEnable_UBX_NAV_HPPOSLLH = 0;
    publox->bEnable_UBX_NAV_POSLLH = 1;
    publox->bEnable_UBX_NAV_PVT = 1;
    publox->bEnable_UBX_NAV_RELPOSNED = 0;
    publox->bEnable_UBX_NAV_SOL = 0;
    publox->bEnable_UBX_NAV_STATUS = 1;
    publox->bEnable_UBX_NAV_SVIN = 0;
    publox->bEnable_UBX_NAV_VELNED = 0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      local_188 = &publox->threadperiod;
      local_180 = &publox->bSaveRawData;
      local_178 = &publox->bRevertToDefaultCfg;
      local_170 = &publox->SetCfg;
      local_168 = &publox->SurveyMode;
      local_160 = &publox->svinMinDur;
      local_158 = &publox->svinAccLimit;
      local_150 = &publox->fixedLat;
      local_148 = &publox->fixedLon;
      local_140 = &publox->fixedAlt;
      local_138 = &publox->fixedPosAcc;
      local_130 = &publox->bDisableRTCMTransfer;
      local_128 = &publox->bSendStartSentence;
      local_120 = publox->szStartSentence;
      local_118 = publox->szStopSentence;
      local_110 = &publox->bEnable_NMEA_GGA;
      local_108 = &publox->bEnable_NMEA_RMC;
      local_100 = &publox->bEnable_NMEA_GLL;
      local_f8 = &publox->bEnable_NMEA_VTG;
      local_f0 = &publox->bEnable_NMEA_HDG;
      local_e8 = &publox->bEnable_NMEA_HDT;
      local_e0 = &publox->bEnable_NMEA_ROT;
      local_d8 = &publox->bEnable_NMEA_MWV;
      local_d0 = &publox->bEnable_NMEA_MWD;
      local_c8 = &publox->bEnable_NMEA_MDA;
      local_c0 = &publox->bEnable_NMEA_DID;
      local_b8 = &publox->bEnable_NMEA_VDM;
      local_b0 = &publox->bEnable_NMEA_PD6_SA;
      local_a8 = &publox->bEnable_NMEA_PD6_TS;
      local_a0 = &publox->bEnable_NMEA_PD6_BI;
      local_98 = &publox->bEnable_NMEA_PD6_BS;
      local_90 = &publox->bEnable_NMEA_PD6_BE;
      local_88 = &publox->bEnable_NMEA_PD6_BD;
      local_80 = &publox->bEnable_UBX_NAV_HPPOSLLH;
      local_78 = &publox->bEnable_UBX_NAV_POSLLH;
      local_70 = &publox->bEnable_UBX_NAV_PVT;
      local_68 = &publox->bEnable_UBX_NAV_RELPOSNED;
      local_60 = &publox->bEnable_UBX_NAV_SOL;
      local_58 = &publox->bEnable_UBX_NAV_STATUS;
      local_50 = &publox->bEnable_UBX_NAV_SVIN;
      local_48 = &publox->bEnable_UBX_NAV_VELNED;
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001513a4;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001513a4:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%255s",publox->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_0015142d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0015142d:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",&publox->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001514ac;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001514ac:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",&publox->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151535;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151535:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_188);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001515b9;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001515b9:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_180);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_0015163d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0015163d:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_178);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001516c1;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001516c1:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_170);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151745;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151745:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_168);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001517c9;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001517c9:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%lf",local_160);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_0015184d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0015184d:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%lf",local_158);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001518d1;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001518d1:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%lf",local_150);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151955;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151955:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%lf",local_148);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001519d9;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001519d9:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%lf",local_140);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151a5d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151a5d:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%lf",local_138);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151ae1;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151ae1:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_40);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151b65;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151b65:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_130);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151be9;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151be9:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_128);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 == '#' || (local_298 == '%')))
        {
          if (pcVar2 == (char *)0x0) goto LAB_00151c80;
        }
      } while ((local_298 == '/') && ((pcVar2 != (char *)0x0 && (local_297 == '/'))));
      if (pcVar2 == (char *)0x0) {
LAB_00151c80:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%255s",local_120);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151cf4;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151cf4:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_38);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 == '#' || (local_298 == '%')))
        {
          if (pcVar2 == (char *)0x0) goto LAB_00151d7f;
        }
      } while ((local_298 == '/') && ((pcVar2 != (char *)0x0 && (local_297 == '/'))));
      if (pcVar2 == (char *)0x0) {
LAB_00151d7f:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%255s",local_118);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151df3;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151df3:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_110);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151e77;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151e77:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_108);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151efb;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151efb:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_100);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00151f7f;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00151f7f:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_f8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00152003;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00152003:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_f0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00152087;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00152087:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_e8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_0015210b;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0015210b:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_e0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_0015218f;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0015218f:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_d8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00152213;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00152213:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_d0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00152297;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00152297:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_c8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_0015231b;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0015231b:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_c0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_0015239f;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0015239f:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_b8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00152423;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00152423:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_b0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001524a7;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001524a7:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_a8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_0015252b;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0015252b:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_a0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001525af;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001525af:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_98);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00152633;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00152633:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_90);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001526b7;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001526b7:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_88);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_0015273b;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0015273b:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_80);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001527bf;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001527bf:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_78);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00152843;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00152843:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_70);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001528c7;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001528c7:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_68);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_0015294b;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0015294b:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_60);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_001529cf;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001529cf:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_58);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00152a53;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00152a53:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_50);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_298,0x100,__stream), local_298 != '#' && (local_298 != '%')))
        {
          if ((local_298 != '/') || ((pcVar2 == (char *)0x0 || (local_297 != '/'))))
          goto LAB_00152ad7;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00152ad7:
      if (pcVar2 == (char *)0x0 || local_298 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_298,"%d",local_48);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_00152b37;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_00152b37:
  if (publox->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    publox->threadperiod = 100;
  }
  if (90.0 < ABS(publox->fixedLat)) {
    puts("Invalid parameter : fixedLat.");
    publox->fixedLat = 0.0;
  }
  if (180.0 < ABS(publox->fixedLon)) {
    puts("Invalid parameter : fixedLon.");
    publox->fixedLon = 0.0;
  }
  pcVar2 = publox->szStartSentence;
  sVar3 = strlen(pcVar2);
  if (0xfe < sVar3) {
    puts("Invalid parameter : szStartSentence.");
    memset(publox->szStartSentence + 0xb,0,0xf5);
    builtin_strncpy(pcVar2,"$GPS_START",0xb);
  }
  sVar3 = strlen(publox->szStopSentence);
  if (0xfe < sVar3) {
    puts("Invalid parameter : szStopSentence.");
    memset(publox->szStopSentence + 10,0,0xf6);
    builtin_strncpy(publox->szStopSentence,"$GPS_STOP",10);
  }
  memset(&publox->LastUBXData,0,0x1b8);
  iVar1 = OpenRS232Port(&publox->RS232Port,publox->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a ublox.");
    return 1;
  }
  iVar1 = (publox->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if ((iVar1 != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          ((publox->RS232Port).hDev,publox->BaudRate,'\0',0,'\b','\0',
                           publox->timeout), iVar1 != 0)) {
      pcVar2 = "Unable to connect to a ublox.";
      goto LAB_00152d91;
    }
    tcflush(*(int *)&(publox->RS232Port).hDev,2);
  }
  if (publox->bRevertToDefaultCfg == 0) {
LAB_00152cb5:
    if (publox->SetCfg == 1) {
      iVar1 = SetRoverCfgublox(publox);
LAB_00152d13:
      if (iVar1 != 0) goto LAB_00152d8a;
      local_198.tv_sec = 0;
      local_198.tv_nsec = 250000000;
      nanosleep(&local_198,(timespec *)0x0);
    }
    else if (publox->SetCfg == 2) {
      iVar1 = SetBaseCfgublox(publox);
      goto LAB_00152d13;
    }
    if (publox->bSaveCfg != 0) {
      iVar1 = SaveCfgublox(publox);
      if (iVar1 != 0) goto LAB_00152d8a;
      local_198.tv_sec = 0;
      local_198.tv_nsec = 250000000;
      nanosleep(&local_198,(timespec *)0x0);
    }
    if (publox->bSendStartSentence == 0) {
LAB_00152de4:
      puts("ublox connected.");
      return 0;
    }
    sVar3 = strlen(pcVar2);
    iVar1 = TransferToublox(publox,(uchar *)pcVar2,(int)sVar3);
    if (iVar1 == 0) {
      local_198.tv_sec = 0;
      local_198.tv_nsec = 250000000;
      nanosleep(&local_198,(timespec *)0x0);
      goto LAB_00152de4;
    }
  }
  else {
    iVar1 = RevertToDefaultCfgublox(publox);
    if (iVar1 == 0) {
      local_198.tv_sec = 0;
      local_198.tv_nsec = 250000000;
      nanosleep(&local_198,(timespec *)0x0);
      goto LAB_00152cb5;
    }
  }
LAB_00152d8a:
  pcVar2 = "Unable to configure a ublox.";
LAB_00152d91:
  puts(pcVar2);
  CloseRS232Port(&publox->RS232Port);
  return 1;
}

Assistant:

inline int Connectublox(UBLOX* publox, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(publox->szCfgFilePath, 0, sizeof(publox->szCfgFilePath));
	sprintf(publox->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(publox->szDevPath, 0, sizeof(publox->szDevPath));
		sprintf(publox->szDevPath, "COM1");
		publox->BaudRate = 9600;
		publox->timeout = 1000;
		publox->threadperiod = 100;
		publox->bSaveRawData = 1;
		publox->bRevertToDefaultCfg = 1;
		publox->SetCfg = KEEP_CURRENT_CFG_UBX;
		publox->SurveyMode = DISABLED_SURVEY_RECEIVER_MODE_UBX;
		publox->svinMinDur = 30;
		publox->svinAccLimit = 10;
		publox->fixedLat = 0;
		publox->fixedLon = 0;
		publox->fixedAlt = 0;
		publox->fixedPosAcc = 10;
		publox->bSaveCfg = 0;
		publox->bDisableRTCMTransfer = 0;
		publox->bSendStartSentence = 0;
		memset(publox->szStartSentence, 0, sizeof(publox->szStartSentence));
		sprintf(publox->szStartSentence, "$GPS_START");
		publox->bSendStopSentence = 0;
		memset(publox->szStopSentence, 0, sizeof(publox->szStopSentence));
		sprintf(publox->szStopSentence, "$GPS_STOP");
		publox->bEnable_NMEA_GGA = 0;
		publox->bEnable_NMEA_RMC = 0;
		publox->bEnable_NMEA_GLL = 0;
		publox->bEnable_NMEA_VTG = 0;
		publox->bEnable_NMEA_HDG = 0;
		publox->bEnable_NMEA_HDT = 0;
		publox->bEnable_NMEA_ROT = 0;
		publox->bEnable_NMEA_MWV = 0;
		publox->bEnable_NMEA_MWD = 0;
		publox->bEnable_NMEA_MDA = 0;
		publox->bEnable_NMEA_DID = 0;
		publox->bEnable_NMEA_VDM = 0;
		publox->bEnable_NMEA_PD6_SA = 0;
		publox->bEnable_NMEA_PD6_TS = 0;
		publox->bEnable_NMEA_PD6_BI = 0;
		publox->bEnable_NMEA_PD6_BS = 0;
		publox->bEnable_NMEA_PD6_BE = 0;
		publox->bEnable_NMEA_PD6_BD = 0;
		publox->bEnable_UBX_NAV_HPPOSLLH = 0;
		publox->bEnable_UBX_NAV_POSLLH = 1;
		publox->bEnable_UBX_NAV_PVT = 1;
		publox->bEnable_UBX_NAV_RELPOSNED = 0;
		publox->bEnable_UBX_NAV_SOL = 0;
		publox->bEnable_UBX_NAV_STATUS = 1;
		publox->bEnable_UBX_NAV_SVIN = 0;
		publox->bEnable_UBX_NAV_VELNED = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", publox->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bRevertToDefaultCfg) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->SetCfg) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->SurveyMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->svinMinDur) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->svinAccLimit) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->fixedLat) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->fixedLon) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->fixedAlt) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->fixedPosAcc) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bSaveCfg) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bDisableRTCMTransfer) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bSendStartSentence) != 1) printf("Invalid configuration file.\n");
			// Need fgets4() because of '$'...
			if (fgets4(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", publox->szStartSentence) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bSendStopSentence) != 1) printf("Invalid configuration file.\n");
			// Need fgets4() because of '$'...
			if (fgets4(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", publox->szStopSentence) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_GGA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_RMC) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_GLL) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_VTG) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_HDG) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_HDT) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_ROT) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_MWV) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_MWD) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_MDA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_DID) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_VDM) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_SA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_TS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_BI) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_BS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_BE) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_BD) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_HPPOSLLH) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_POSLLH) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_PVT) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_RELPOSNED) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_SOL) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_STATUS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_SVIN) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_VELNED) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (publox->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		publox->threadperiod = 100;
	}
	if ((publox->fixedLat < -90)||(publox->fixedLat > 90))
	{
		printf("Invalid parameter : fixedLat.\n");
		publox->fixedLat = 0;
	}
	if ((publox->fixedLon < -180)||(publox->fixedLon > 180))
	{
		printf("Invalid parameter : fixedLon.\n");
		publox->fixedLon = 0;
	}
	if (strlen(publox->szStartSentence) >= 255)
	{
		printf("Invalid parameter : szStartSentence.\n");
		memset(publox->szStartSentence, 0, sizeof(publox->szStartSentence));
		sprintf(publox->szStartSentence, "$GPS_START");
	}
	if (strlen(publox->szStopSentence) >= 255)
	{
		printf("Invalid parameter : szStopSentence.\n");
		memset(publox->szStopSentence, 0, sizeof(publox->szStopSentence));
		sprintf(publox->szStopSentence, "$GPS_STOP");
	}

	// Used to save raw data, should be handled specifically...
	//publox->pfSaveFile = NULL;

	memset(&publox->LastUBXData, 0, sizeof(UBXDATA));

	if (OpenRS232Port(&publox->RS232Port, publox->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a ublox.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&publox->RS232Port, publox->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)publox->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a ublox.\n");
		CloseRS232Port(&publox->RS232Port);
		return EXIT_FAILURE;
	}

	if (publox->bRevertToDefaultCfg)
	{
		if (RevertToDefaultCfgublox(publox) != EXIT_SUCCESS)
		{
			printf("Unable to configure a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(250);
	}

	switch (publox->SetCfg)
	{
	case SET_BASE_CFG_UBX:
		if (SetBaseCfgublox(publox) != EXIT_SUCCESS)
		{
			printf("Unable to configure a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(250);
		break;
	case SET_ROVER_CFG_UBX:
		if (SetRoverCfgublox(publox) != EXIT_SUCCESS)
		{
			printf("Unable to configure a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(250);
		break;
	case KEEP_CURRENT_CFG_UBX:
	default:
		break;
	}

	if (publox->bSaveCfg)
	{
		if (SaveCfgublox(publox) != EXIT_SUCCESS)
		{
			printf("Unable to configure a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(250);
	}

	if (publox->bSendStartSentence)
	{
		if (TransferToublox(publox, (unsigned char*)publox->szStartSentence, (int)strlen(publox->szStartSentence)) != EXIT_SUCCESS)
		{
			printf("Unable to configure a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(250);
	}

	printf("ublox connected.\n");

	return EXIT_SUCCESS;
}